

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O3

void __thiscall Nussinov::lambda_swipe(Nussinov *this,double incr,ostream *fout,string *outfile)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  size_type __n;
  long lVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<int,_std::allocator<int>_> rna_n;
  NussinovAlgorithm F;
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  temp;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  string rna;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  double local_1c8;
  vector<int,_std::allocator<int>_> local_1b8;
  NussinovAlgorithm local_1a0;
  undefined1 local_168 [16];
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  pointer local_130;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_128;
  undefined1 *local_110;
  size_type local_108;
  undefined1 local_100 [16];
  string *local_f0;
  double local_e8;
  vector<int,_std::allocator<int>_> *local_e0;
  pointer local_d8;
  string local_d0;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  string local_68;
  undefined1 local_48 [16];
  
  local_f0 = outfile;
  local_e8 = incr;
  dVar4 = ceil(1.0 / incr + 1.0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size: ",6);
  plVar6 = (long *)std::ostream::operator<<(&std::cout,(int)dVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  __n = (size_type)(int)dVar4;
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_80,__n,(value_type_conflict2 *)&local_1a0,(allocator_type *)&local_150);
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,__n,(value_type_conflict2 *)&local_1a0,(allocator_type *)&local_150);
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_b0,__n,(value_type_conflict2 *)&local_1a0,(allocator_type *)&local_150);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&local_128,3,(allocator_type *)&local_1a0);
  local_150 = local_140;
  lVar8 = 0;
  local_148 = 0;
  local_140[0] = 0;
  local_130 = (pointer)0x0;
  local_110 = local_100;
  local_108 = 0;
  local_100[0] = 0;
  local_e0 = &this->protein;
  local_1c8 = 0.0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"lambda: ",8);
    poVar7 = std::ostream::_M_insert<double>(local_1c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    nussinov_CAI_abi_cxx11_
              ((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1a0,this,local_1c8,fout);
    local_130 = local_1a0.dp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_1a0);
    if ((pointer *)
        local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_d8 = local_130;
    std::__cxx11::string::_M_assign((string *)&local_110);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1b8,local_108,(allocator_type *)&local_1a0);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_110,local_110 + local_108);
    transform2num(&local_1b8,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    dVar4 = getCAI_s(&local_1b8,local_e0);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar4;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_168._8_8_ = 0;
    local_168._0_8_ = -(ulong)(local_1c8 == 1.0);
    *(double *)
     ((long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar8) = local_1c8;
    NussinovAlgorithm::NussinovAlgorithm
              (&local_1a0,&local_1b8,
               (int)((ulong)((long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2),this->g);
    poVar7 = std::ostream::_M_insert<double>(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<double>((double)local_d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    uVar2 = ~local_168._0_8_;
    uVar3 = ~local_168._8_8_;
    local_168._8_4_ = (int)(uVar3 & local_48._8_8_);
    local_168._0_8_ = uVar2 & local_48._0_8_;
    local_168._12_4_ = (int)((uVar3 & local_48._8_8_) >> 0x20);
    poVar7 = std::ostream::_M_insert<double>((double)(uVar2 & local_48._0_8_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    iVar5 = NussinovAlgorithm::nussinov
                      (&local_1a0,0,
                       (int)((ulong)((long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    iVar5 = NussinovAlgorithm::nussinov
                      (&local_1a0,0,
                       (int)((ulong)((long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    poVar7 = std::ostream::_M_insert<double>
                       ((double)iVar5 * local_1c8 + (1.0 - local_1c8) * (double)local_168._0_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = NussinovAlgorithm::nussinov
                      (&local_1a0,0,
                       (int)((ulong)((long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    *(ulong *)((long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar8) =
         ~-(ulong)(local_1c8 == 0.0) & (ulong)(double)iVar5;
    *(undefined8 *)
     ((long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar8) = local_168._0_8_;
    NussinovAlgorithm::~NussinovAlgorithm(&local_1a0);
    if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1c8 = local_1c8 + local_e8;
    lVar8 = lVar8 + 8;
  } while (local_1c8 < 1.001);
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x147214;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,&local_80);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             local_128.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&local_1a0);
  if (local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x14776d;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,&local_98);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_128.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&local_1a0);
  if (local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x147973;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,&local_b0);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_128.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)&local_1a0);
  if (local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    operator_delete(local_1a0.rna.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  pcVar1 = (local_f0->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + local_f0->_M_string_length);
  write_csv(&local_68,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swipe done",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&local_128);
  if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Nussinov::lambda_swipe(double incr, ostream &fout, string outfile) {
    int size = ceil(1/incr + 1);
    cout << "size: " << size << endl;
    vector<double> lambda_buffer(size, 0);
    vector<double> F_buffer(size, 0);
    vector<double> CAI_buffer(size, 0);
    vector<pair<string, vector<double>>> dataset(3);
    int index = 0;
    double O;
    double CAI = 0;
    tuple<double, string> temp;

    string rna;
    double lambda = 0;
    while (lambda < 1.001) {
        fout << "lambda: " << lambda << endl;
        temp = nussinov_CAI(lambda, fout);
        O = get<0>(temp);
        rna = get<1>(temp);
        vector<int> rna_n(rna.size());
        transform2num(rna_n, rna);
        CAI = getCAI_s(rna_n, protein);
        if (lambda == 1) CAI = 0;
        lambda_buffer[index] = lambda;
        NussinovAlgorithm F = NussinovAlgorithm(rna_n, rna_n.size(), g);
        cout << lambda << " " << O << " " << CAI << " " << F.nussinov(0, rna_n.size()-1) << " " << lambda*(F.nussinov(0, rna_n.size()-1))+(1-lambda)*CAI << endl;
        F_buffer[index] = F.nussinov(0, rna_n.size()-1);
        if (lambda == 0) F_buffer[index] = 0;
        CAI_buffer[index] = CAI;
        index++;
        lambda += incr;
    }
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("F", F_buffer);
    dataset[2] = make_pair("CAI", CAI_buffer);
    write_csv(outfile, dataset);
    cout << "swipe done" << endl;
}